

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrep.c
# Opt level: O2

int nn_xrep_create(void *hint,nn_sockbase **sockbase)

{
  nn_xrep *self;
  
  self = (nn_xrep *)nn_alloc_(0x1b0);
  if (self != (nn_xrep *)0x0) {
    nn_xrep_init(self,&nn_xrep_sockbase_vfptr,hint);
    *sockbase = (nn_sockbase *)self;
    return 0;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Out of memory (%s:%d)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/xrep.c"
          ,0x10b);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static int nn_xrep_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_xrep *self;

    self = nn_alloc (sizeof (struct nn_xrep), "socket (xrep)");
    alloc_assert (self);
    nn_xrep_init (self, &nn_xrep_sockbase_vfptr, hint);
    *sockbase = &self->sockbase;

    return 0;
}